

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableMethodsGroupWalker::AddItem
          (RecyclableMethodsGroupWalker *this,PropertyId propertyId,Var obj)

{
  code *pcVar1;
  bool bVar2;
  ArenaAllocator *alloc;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  undefined4 *puVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  DebuggerPropertyDisplayInfo *this_00;
  TrackAllocData local_50;
  DebuggerPropertyDisplayInfo *local_28;
  DebuggerPropertyDisplayInfo *info;
  Var obj_local;
  RecyclableMethodsGroupWalker *pRStack_10;
  PropertyId propertyId_local;
  RecyclableMethodsGroupWalker *this_local;
  
  info = (DebuggerPropertyDisplayInfo *)obj;
  obj_local._4_4_ = propertyId;
  pRStack_10 = this;
  if ((this->super_RecyclableObjectWalker).pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
    pLVar3 = JsUtil::
             List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc,4);
    (this->super_RecyclableObjectWalker).pMembersList = pLVar3;
  }
  if ((this->super_RecyclableObjectWalker).pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf38,"(pMembersList)","pMembersList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pAVar5 = &GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&DebuggerPropertyDisplayInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0xf3a);
  pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar5,&local_50);
  this_00 = (DebuggerPropertyDisplayInfo *)
            new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar5,0x3f67b0);
  DebuggerPropertyDisplayInfo::DebuggerPropertyDisplayInfo(this_00,obj_local._4_4_,info,1);
  local_28 = this_00;
  if (this_00 == (DebuggerPropertyDisplayInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf3b,"(info)","info");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  JsUtil::
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add((this->super_RecyclableObjectWalker).pMembersList,&local_28);
  return;
}

Assistant:

void RecyclableMethodsGroupWalker::AddItem(Js::PropertyId propertyId, Var obj)
    {
        if (pMembersList == nullptr)
        {
            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
        }

        Assert(pMembersList);

        DebuggerPropertyDisplayInfo *info = Anew(GetArenaFromContext(scriptContext), DebuggerPropertyDisplayInfo, propertyId, obj, DebuggerPropertyDisplayInfoFlags_Const);
        Assert(info);
        pMembersList->Add(info);
    }